

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::Model
          (Model *this,shared_ptr<fasttext::Matrix> *wi,shared_ptr<fasttext::Matrix> *wo,
          shared_ptr<fasttext::Args> *args,int32_t seed)

{
  element_type *peVar1;
  element_type *peVar2;
  long in_RDI;
  shared_ptr<fasttext::Args> *__s;
  shared_ptr<fasttext::Args> *this_00;
  int64_t in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x1612f8);
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x16130b);
  std::shared_ptr<fasttext::Args>::shared_ptr((shared_ptr<fasttext::Args> *)0x16131e);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x161336);
  Vector::Vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x161361);
  Vector::Vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x161389);
  Vector::Vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __s = (shared_ptr<fasttext::Args> *)(in_RDI + 0x78);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1613ae);
  this_00 = (shared_ptr<fasttext::Args> *)(in_RDI + 0x98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1613c4);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)0x1613da);
  std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::vector
            ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)0x1613f0);
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)this_00,
             (result_type)__s);
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)this_00,(shared_ptr<fasttext::Matrix> *)__s);
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)this_00,(shared_ptr<fasttext::Matrix> *)__s);
  std::shared_ptr<fasttext::Args>::operator=(this_00,__s);
  peVar1 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16144a);
  *(int *)(in_RDI + 100) = (int)peVar1->m_;
  peVar1 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x161463);
  *(int *)(in_RDI + 0x68) = (int)peVar1->m_;
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16147c);
  *(int *)(in_RDI + 0x60) = peVar2->dim;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 1;
  return;
}

Assistant:

Model::Model(std::shared_ptr<Matrix> wi,
             std::shared_ptr<Matrix> wo,
             std::shared_ptr<Args> args,
             int32_t seed)
  : hidden_(args->dim), output_(wo->m_), grad_(args->dim), rng(seed)
{
  //std::cout << "Seed: " << seed << std::endl;
  wi_ = wi;
  wo_ = wo;
  args_ = args;
  isz_ = wi->m_;
  osz_ = wo->m_;
  hsz_ = args->dim;
  negpos = 0;
  loss_ = 0.0;
  nexamples_ = 1;
}